

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O1

void __thiscall
icu_63::Locale::Locale
          (Locale *this,char *newLanguage,char *newCountry,char *newVariant,char *newKeywords)

{
  ulong uVar1;
  char *pcVar2;
  uint uVar3;
  int sLength;
  size_t sVar4;
  CharString *this_00;
  char *pcVar5;
  char c;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  UErrorCode status;
  CharString togo;
  UErrorCode local_94;
  StringPiece local_90;
  StringPiece local_80;
  CharString local_70;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Locale_003adcd8;
  this->fullName = this->fullNameBuffer;
  this->baseName = (char *)0x0;
  if ((newLanguage == (char *)0x0 && newCountry == (char *)0x0) && newVariant == (char *)0x0) {
    init(this,(EVP_PKEY_CTX *)0x0);
    return;
  }
  local_94 = U_ZERO_ERROR;
  if (newLanguage == (char *)0x0) {
    uVar7 = 0;
  }
  else {
    sVar4 = strlen(newLanguage);
    uVar7 = (uint)sVar4;
    if (0x15555555 < uVar7) {
      setToBogus(this);
      return;
    }
  }
  MaybeStackArray<char,_40>::MaybeStackArray(&local_70.buffer);
  local_70.len = 0;
  *local_70.buffer.ptr = '\0';
  CharString::append(&local_70,newLanguage,uVar7,&local_94);
  sLength = 0;
  uVar7 = 0;
  if (newCountry == (char *)0x0) {
LAB_00285858:
    if (newVariant == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      pcVar5 = newVariant + -1;
      do {
        pcVar9 = pcVar5;
        pcVar5 = pcVar9 + 1;
      } while (pcVar9[1] == '_');
      sVar4 = strlen(pcVar5);
      uVar3 = (uint)sVar4;
      if (0x15555555 < uVar3) goto LAB_002859bb;
      uVar8 = 1;
      uVar6 = (ulong)(uVar3 & 0x1fffffff);
      if ((int)uVar3 < 1) {
        uVar8 = sVar4 & 0xffffffff;
      }
      do {
        sLength = (int)uVar8;
        if ((long)uVar6 < 2) goto LAB_002858b1;
        uVar1 = uVar6 - 1;
        pcVar2 = pcVar9 + uVar6;
        uVar6 = uVar1;
      } while (*pcVar2 == '_');
      sLength = (int)uVar1 + 1;
    }
LAB_002858b1:
    if (newKeywords == (char *)0x0) {
      bVar10 = true;
    }
    else {
      sVar4 = strlen(newKeywords);
      if (0x15555555 < (uint)sVar4) goto LAB_002859bb;
      bVar10 = (uint)sVar4 == 0;
    }
    if (sLength != 0 || uVar7 != 0) {
      CharString::append(&local_70,'_',&local_94);
    }
    if (uVar7 != 0) {
      StringPiece::StringPiece(&local_80,newCountry);
      CharString::append(&local_70,local_80.ptr_,local_80.length_,&local_94);
    }
    if (sLength != 0) {
      this_00 = CharString::append(&local_70,'_',&local_94);
      CharString::append(this_00,pcVar5,sLength,&local_94);
    }
    if (!bVar10) {
      pcVar5 = strchr(newKeywords,0x3d);
      c = '@';
      if (pcVar5 == (char *)0x0) {
        CharString::append(&local_70,'_',&local_94);
        if (sLength == 0) {
          c = '_';
          goto LAB_00285962;
        }
      }
      else {
LAB_00285962:
        CharString::append(&local_70,c,&local_94);
      }
      StringPiece::StringPiece(&local_90,newKeywords);
      CharString::append(&local_70,local_90.ptr_,local_90.length_,&local_94);
    }
    if (local_94 < U_ILLEGAL_ARGUMENT_ERROR) {
      init(this,(EVP_PKEY_CTX *)local_70.buffer.ptr);
      goto LAB_002859c3;
    }
  }
  else {
    sVar4 = strlen(newCountry);
    uVar7 = (uint)sVar4;
    if (uVar7 < 0x15555556) goto LAB_00285858;
  }
LAB_002859bb:
  setToBogus(this);
LAB_002859c3:
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_70.buffer);
  return;
}

Assistant:

Locale::Locale( const   char * newLanguage,
                const   char * newCountry,
                const   char * newVariant,
                const   char * newKeywords)
    : UObject(), fullName(fullNameBuffer), baseName(NULL)
{
    if( (newLanguage==NULL) && (newCountry == NULL) && (newVariant == NULL) )
    {
        init(NULL, FALSE); /* shortcut */
    }
    else
    {
        UErrorCode status = U_ZERO_ERROR;
        int32_t size = 0;
        int32_t lsize = 0;
        int32_t csize = 0;
        int32_t vsize = 0;
        int32_t ksize = 0;

        // Calculate the size of the resulting string.

        // Language
        if ( newLanguage != NULL )
        {
            lsize = (int32_t)uprv_strlen(newLanguage);
            if ( lsize < 0 || lsize > ULOC_STRING_LIMIT ) { // int32 wrap
                setToBogus();
                return;
            }
            size = lsize;
        }

        CharString togo(newLanguage, lsize, status); // start with newLanguage

        // _Country
        if ( newCountry != NULL )
        {
            csize = (int32_t)uprv_strlen(newCountry);
            if ( csize < 0 || csize > ULOC_STRING_LIMIT ) { // int32 wrap
                setToBogus();
                return;
            }
            size += csize;
        }

        // _Variant
        if ( newVariant != NULL )
        {
            // remove leading _'s
            while(newVariant[0] == SEP_CHAR)
            {
                newVariant++;
            }

            // remove trailing _'s
            vsize = (int32_t)uprv_strlen(newVariant);
            if ( vsize < 0 || vsize > ULOC_STRING_LIMIT ) { // int32 wrap
                setToBogus();
                return;
            }
            while( (vsize>1) && (newVariant[vsize-1] == SEP_CHAR) )
            {
                vsize--;
            }
        }

        if( vsize > 0 )
        {
            size += vsize;
        }

        // Separator rules:
        if ( vsize > 0 )
        {
            size += 2;  // at least: __v
        }
        else if ( csize > 0 )
        {
            size += 1;  // at least: _v
        }

        if ( newKeywords != NULL)
        {
            ksize = (int32_t)uprv_strlen(newKeywords);
            if ( ksize < 0 || ksize > ULOC_STRING_LIMIT ) {
              setToBogus();
              return;
            }
            size += ksize + 1;
        }

        //  NOW we have the full locale string..
        // Now, copy it back.

        // newLanguage is already copied

        if ( ( vsize != 0 ) || (csize != 0) )  // at least:  __v
        {                                      //            ^
            togo.append(SEP_CHAR, status);
        }

        if ( csize != 0 )
        {
            togo.append(newCountry, status);
        }

        if ( vsize != 0)
        {
            togo.append(SEP_CHAR, status)
                .append(newVariant, vsize, status);
        }

        if ( ksize != 0)
        {
            if (uprv_strchr(newKeywords, '=')) {
                togo.append('@', status); /* keyword parsing */
            }
            else {
                togo.append('_', status); /* Variant parsing with a script */
                if ( vsize == 0) {
                    togo.append('_', status); /* No country found */
                }
            }
            togo.append(newKeywords, status);
        }

        if (U_FAILURE(status)) {
            // Something went wrong with appending, etc.
            setToBogus();
            return;
        }
        // Parse it, because for example 'language' might really be a complete
        // string.
        init(togo.data(), FALSE);
    }
}